

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAnnotationObjectHelper.cc
# Opt level: O0

Rectangle * __thiscall
QPDFAnnotationObjectHelper::getRect
          (Rectangle *__return_storage_ptr__,QPDFAnnotationObjectHelper *this)

{
  allocator<char> local_51;
  string local_50 [32];
  QPDFObjectHelper local_30;
  QPDFAnnotationObjectHelper *this_local;
  
  local_30.oh_.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  QPDFObjectHelper::oh(&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"/Rect",&local_51);
  QPDFObjectHandle::getKey
            ((QPDFObjectHandle *)
             &local_30.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (string *)&local_30);
  QPDFObjectHandle::getArrayAsRectangle
            (__return_storage_ptr__,
             (QPDFObjectHandle *)
             &local_30.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &local_30.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Rectangle
QPDFAnnotationObjectHelper::getRect()
{
    return oh().getKey("/Rect").getArrayAsRectangle();
}